

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

bool __thiscall ftxui::InputBase::OnEvent(InputBase *this,Event *event)

{
  bool bVar1;
  string *this_00;
  string *psVar2;
  wstring local_90;
  undefined1 local_70 [64];
  
  psVar2 = (this->content_).address_;
  if (psVar2 == (string *)0x0) {
    psVar2 = &(this->content_).owned_;
  }
  to_wstring(&local_90,psVar2);
  std::__cxx11::wstring::operator=((wstring *)&this->wrapped_content_,(wstring *)&local_90);
  std::__cxx11::wstring::~wstring((wstring *)&local_90);
  Event::Event((Event *)local_70,event);
  bVar1 = WideInputBase::OnEvent(&this->super_WideInputBase,(Event *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 0x18));
  if (bVar1) {
    to_string((string *)&local_90,&this->wrapped_content_);
    psVar2 = (this->content_).address_;
    this_00 = &(this->content_).owned_;
    if (psVar2 != (string *)0x0) {
      this_00 = psVar2;
    }
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return bVar1;
}

Assistant:

bool OnEvent(Event event) override {
    wrapped_content_ = to_wstring(*content_);
    if (WideInputBase::OnEvent(event)) {
      *content_ = to_string(wrapped_content_);
      return true;
    }
    return false;
  }